

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiconloader.cpp
# Opt level: O0

QPixmap * __thiscall
PixmapEntry::pixmap(PixmapEntry *this,QSize *size,Mode mode,State state,qreal scale)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  QSize this_00;
  unsigned_long_long uVar5;
  QGuiApplication *pQVar6;
  QObjectPrivate *pQVar7;
  undefined4 in_ECX;
  long in_RSI;
  QSize in_RDI;
  long in_FS_OFFSET;
  QSize *s;
  QGuiApplication *guiApp;
  qreal calculatedDpr;
  QPixmap *cachedPixmap;
  QString key;
  QSize actualSize;
  undefined4 in_stack_fffffffffffffdc8;
  ImageConversionFlag in_stack_fffffffffffffdcc;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_HexString<unsigned_long_long>_>,_HexString<unsigned_char>_>,_HexString<unsigned_long_long>_>,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>
  *in_stack_fffffffffffffdd0;
  QPixmap *in_stack_fffffffffffffdd8;
  QSize this_01;
  QSize *in_stack_fffffffffffffdf8;
  TransformationMode in_stack_fffffffffffffe00;
  AspectRatioMode in_stack_fffffffffffffe04;
  QPixmap *in_stack_fffffffffffffe08;
  undefined1 local_1c0 [52];
  QSize local_18c;
  HexString<unsigned_short> local_182;
  HexString<unsigned_int> local_180;
  HexString<unsigned_int> local_17c;
  HexString<unsigned_long_long> local_178;
  HexString<unsigned_char> local_169;
  HexString<unsigned_long_long> local_168;
  QLatin1StringView local_160;
  undefined1 *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  QFlagsStorage<Qt::ImageConversionFlag> in_stack_fffffffffffffee4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  bVar2 = QPixmap::isNull((QPixmap *)in_stack_fffffffffffffdd0);
  if (bVar2) {
    in_stack_fffffffffffffdd0 =
         (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_HexString<unsigned_long_long>_>,_HexString<unsigned_char>_>,_HexString<unsigned_long_long>_>,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>
          *)(in_RSI + 0x48);
    in_stack_fffffffffffffdd8 = (QPixmap *)(in_RSI + 8);
    QFlags<Qt::ImageConversionFlag>::QFlags
              ((QFlags<Qt::ImageConversionFlag> *)in_stack_fffffffffffffdd0,
               in_stack_fffffffffffffdcc);
    QPixmap::load(in_stack_fffffffffffffe08,
                  (QString *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                  (char *)in_stack_fffffffffffffdf8,
                  (ImageConversionFlags)in_stack_fffffffffffffee4.i);
  }
  ::operator*((QSize *)in_RDI,(qreal)in_stack_fffffffffffffdd8);
  this_00 = QPixmap::size((QPixmap *)in_RDI);
  QPixmapIconEngine::adjustSize((QSize *)in_stack_fffffffffffffdd8,in_RDI);
  s = (QSize *)QIconPrivate::pixmapDevicePixelRatio
                         ((qreal)in_stack_fffffffffffffe08,
                          (QSize *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                          in_stack_fffffffffffffdf8);
  local_138 = &DAT_aaaaaaaaaaaaaaaa;
  local_130 = &DAT_aaaaaaaaaaaaaaaa;
  local_128 = &DAT_aaaaaaaaaaaaaaaa;
  local_160 = Qt::Literals::StringLiterals::operator____L1
                        ((char *)in_stack_fffffffffffffdd8,(size_t)in_stack_fffffffffffffdd0);
  uVar5 = QPixmap::cacheKey((QPixmap *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8)
                           );
  HexString<unsigned_long_long>::HexString(&local_168,uVar5);
  ::operator%((QLatin1String *)in_stack_fffffffffffffdd0,
              (HexString<unsigned_long_long> *)
              CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  HexString<unsigned_char>::HexString(&local_169,(uchar)in_ECX);
  ::operator%((QStringBuilder<QLatin1String,_HexString<unsigned_long_long>_> *)
              in_stack_fffffffffffffdd0,
              (HexString<unsigned_char> *)
              CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  QGuiApplication::palette();
  uVar5 = QPalette::cacheKey((QPalette *)in_stack_fffffffffffffdd0);
  HexString<unsigned_long_long>::HexString(&local_178,uVar5);
  ::operator%((QStringBuilder<QStringBuilder<QLatin1String,_HexString<unsigned_long_long>_>,_HexString<unsigned_char>_>
               *)in_stack_fffffffffffffdd0,
              (HexString<unsigned_long_long> *)
              CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  uVar3 = QSize::width((QSize *)0x2a3953);
  HexString<unsigned_int>::HexString(&local_17c,uVar3);
  ::operator%((QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_HexString<unsigned_long_long>_>,_HexString<unsigned_char>_>,_HexString<unsigned_long_long>_>
               *)in_stack_fffffffffffffdd0,
              (HexString<unsigned_int> *)
              CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  uVar3 = QSize::height((QSize *)0x2a398c);
  HexString<unsigned_int>::HexString(&local_180,uVar3);
  ::operator%(&in_stack_fffffffffffffdd0->a,
              (HexString<unsigned_int> *)
              CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  iVar4 = qRound(1.367231320196e-317);
  HexString<unsigned_short>::HexString(&local_182,(unsigned_short)iVar4);
  ::operator%(in_stack_fffffffffffffdd0,
              (HexString<unsigned_short> *)
              CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  ::QStringBuilder::operator_cast_to_QString
            ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_HexString<unsigned_long_long>_>,_HexString<unsigned_char>_>,_HexString<unsigned_long_long>_>,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>,_HexString<unsigned_short>_>
              *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  QPalette::~QPalette((QPalette *)in_stack_fffffffffffffdd0);
  in_stack_fffffffffffffe04 = in_stack_fffffffffffffe04 & 0xffffff;
  *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)((long)in_RDI + 8) = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)((long)in_RDI + 0x10) = &DAT_aaaaaaaaaaaaaaaa;
  QPixmap::QPixmap((QPixmap *)in_stack_fffffffffffffdd0);
  bVar2 = QPixmapCache::find((QString *)in_stack_fffffffffffffdd8,
                             (QPixmap *)in_stack_fffffffffffffdd0);
  if (!bVar2) {
    local_18c = QPixmap::size((QPixmap *)in_RDI);
    bVar2 = ::operator!=((QSize *)in_stack_fffffffffffffdd0,
                         (QSize *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    if (bVar2) {
      QPixmap::scaled((QPixmap *)this_00,s,in_stack_fffffffffffffe04,in_stack_fffffffffffffe00);
      QPixmap::operator=(in_stack_fffffffffffffdd8,(QPixmap *)in_stack_fffffffffffffdd0);
      QPixmap::~QPixmap((QPixmap *)in_stack_fffffffffffffdd0);
    }
    else {
      QPixmap::operator=((QPixmap *)this_01,(QPixmap *)in_RDI);
    }
    QCoreApplication::instance();
    pQVar6 = qobject_cast<QGuiApplication*>((QObject *)0x2a3b0b);
    if (pQVar6 != (QGuiApplication *)0x0) {
      pQVar7 = QObjectPrivate::get((QObject *)0x2a3b22);
      (**(code **)(*(long *)pQVar7 + 0x70))(local_1c0,pQVar7,in_ECX,in_RDI);
      QPixmap::operator=(in_stack_fffffffffffffdd8,(QPixmap *)in_stack_fffffffffffffdd0);
      QPixmap::~QPixmap((QPixmap *)in_stack_fffffffffffffdd0);
    }
    QPixmap::setDevicePixelRatio((QPixmap *)in_RDI,(qreal)in_stack_fffffffffffffdd8);
    QPixmapCache::insert((QString *)this_01,(QPixmap *)in_RDI);
  }
  QString::~QString((QString *)0x2a3b9f);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QPixmap *)this_01;
  }
  __stack_chk_fail();
}

Assistant:

QPixmap PixmapEntry::pixmap(const QSize &size, QIcon::Mode mode, QIcon::State state, qreal scale)
{
    Q_UNUSED(state);

    // Ensure that basePixmap is lazily initialized before generating the
    // key, otherwise the cache key is not unique
    if (basePixmap.isNull())
        basePixmap.load(filename);

    // If the size of the best match we have (basePixmap) is larger than the
    // requested size, we downscale it to match.
    const auto actualSize = QPixmapIconEngine::adjustSize(size * scale, basePixmap.size());
    const auto calculatedDpr = QIconPrivate::pixmapDevicePixelRatio(scale, size, actualSize);
    QString key = "$qt_theme_"_L1
                  % HexString<quint64>(basePixmap.cacheKey())
                  % HexString<quint8>(mode)
                  % HexString<quint64>(QGuiApplication::palette().cacheKey())
                  % HexString<uint>(actualSize.width())
                  % HexString<uint>(actualSize.height())
                  % HexString<quint16>(qRound(calculatedDpr * 1000));

    QPixmap cachedPixmap;
    if (QPixmapCache::find(key, &cachedPixmap)) {
        return cachedPixmap;
    } else {
        if (basePixmap.size() != actualSize)
            cachedPixmap = basePixmap.scaled(actualSize, Qt::IgnoreAspectRatio, Qt::SmoothTransformation);
        else
            cachedPixmap = basePixmap;
        if (QGuiApplication *guiApp = qobject_cast<QGuiApplication *>(qApp))
            cachedPixmap = static_cast<QGuiApplicationPrivate*>(QObjectPrivate::get(guiApp))->applyQIconStyleHelper(mode, cachedPixmap);
        cachedPixmap.setDevicePixelRatio(calculatedDpr);
        QPixmapCache::insert(key, cachedPixmap);
    }
    return cachedPixmap;
}